

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O3

void __thiscall rsg::VariableManager::declareVariable(VariableManager *this,Variable *variable)

{
  ValueEntry **__src;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  __dest;
  ValueEntry **ppVVar1;
  pointer ppVVar2;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                     ((this->m_entryCache).
                      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->m_entryCache).
                      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  ppVVar1 = (this->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != ppVVar1) {
    __src = __dest._M_current + 1;
    if (__src != ppVVar1) {
      memmove(__dest._M_current,__src,(long)ppVVar1 - (long)__src);
      ppVVar1 = (this->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->m_entryCache).
    super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar1 + -1;
  }
  for (ppVVar2 = (this->m_valueScopeStack).
                 super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar2 !=
      (this->m_valueScopeStack).
      super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar2 = ppVVar2 + 1) {
    ValueScope::removeValue(*ppVVar2,variable);
  }
  VariableScope::declare
            ((this->m_variableScopeStack).
             super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl
             .super__Vector_impl_data._M_finish[-1],variable);
  return;
}

Assistant:

void VariableManager::declareVariable (Variable* variable)
{
	// Remove from cache if exists in there.
	std::vector<const ValueEntry*>::iterator pos = std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable));
	if (pos != m_entryCache.end())
		m_entryCache.erase(pos);

	DE_ASSERT(std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable)) == m_entryCache.end());

	// Remove from scope stack.
	for (vector<ValueScope*>::const_iterator stackIter = m_valueScopeStack.begin(); stackIter != m_valueScopeStack.end(); stackIter++)
	{
		ValueScope* scope = *stackIter;
		scope->removeValue(variable);
	}

	// Declare in current scope.
	getCurVariableScope().declare(variable);
}